

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O1

sysbvm_tuple_t
sysbvm_string_createWithSuffix(sysbvm_context_t *context,sysbvm_tuple_t string,char *suffix)

{
  size_t __n;
  sysbvm_object_tuple_t *psVar1;
  size_t __n_00;
  
  __n = strlen(suffix);
  psVar1 = (sysbvm_object_tuple_t *)string;
  if (__n != 0) {
    if ((string & 0xf) == 0 && string != 0) {
      __n_00 = (size_t)*(uint *)(string + 0xc);
    }
    else {
      __n_00 = 0;
    }
    psVar1 = sysbvm_context_allocateByteTuple(context,(context->roots).stringType,__n + __n_00);
    memcpy(&psVar1->field_1,(void *)(string + 0x10),__n_00);
    memcpy((void *)((long)&psVar1->field_1 + __n_00),suffix,__n);
  }
  return (sysbvm_tuple_t)psVar1;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_string_createWithSuffix(sysbvm_context_t *context, sysbvm_tuple_t string, const char *suffix)
{
    size_t suffixLen = strlen(suffix);
    if(suffixLen == 0)
        return string;

    size_t stringSize = sysbvm_tuple_getSizeInBytes(string);
    sysbvm_tuple_t result = sysbvm_string_createEmptyWithSize(context, stringSize + suffixLen);
    uint8_t *resultData = SYSBVM_CAST_OOP_TO_OBJECT_TUPLE(result)->bytes;
    memcpy(resultData, SYSBVM_CAST_OOP_TO_OBJECT_TUPLE(string)->bytes, stringSize);
    memcpy(resultData + stringSize, suffix, suffixLen);
    return result;
}